

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerHLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  uint uVar1;
  uint uVar2;
  runtime_error *prVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint local_58;
  uint local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = *(uint *)&(out_type->super_IVariant).field_0xc;
  uVar6 = uVar1 ^ 8;
  uVar2 = *(uint *)&(in_type->super_IVariant).field_0xc;
  if (uVar6 != 0 || (uVar2 ^ 7) != 0) {
    if ((uVar1 ^ 10) != 0 || (uVar2 ^ 9) != 0) {
      if (uVar6 == 0 && (uVar2 ^ 0xd) == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = "asuint";
        pcVar4 = "";
        goto LAB_0026e1bc;
      }
      uVar7 = uVar2 ^ 8;
      if ((uVar1 ^ 7) != 0 || uVar7 != 0) {
        local_54 = uVar1 ^ 9;
        local_58 = uVar2 ^ 10;
        if (local_54 != 0 || local_58 != 0) {
          if ((uVar1 ^ 7) == 0 && (uVar2 ^ 0xd) == 0) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar5 = "asint";
            pcVar4 = "";
          }
          else if (((uVar1 ^ 0xd) == 0 && uVar7 == 0) || ((uVar1 ^ 0xd) == 0 && (uVar2 ^ 7) == 0)) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar5 = "asfloat";
            pcVar4 = "";
          }
          else {
            local_54 = local_54 | uVar2 ^ 0xe;
            if (local_54 == 0) {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Double to Int64 is not supported in HLSL.","");
              ::std::runtime_error::runtime_error(prVar3,(string *)&local_78);
              *(undefined ***)prVar3 = &PTR__runtime_error_003fce08;
              __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((uVar1 ^ 10) == 0 && (uVar2 ^ 0xe) == 0) {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Double to UInt64 is not supported in HLSL.","");
              ::std::runtime_error::runtime_error(prVar3,(string *)&local_78);
              *(undefined ***)prVar3 = &PTR__runtime_error_003fce08;
              __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if (((uVar2 ^ 9) == 0 && (uVar1 ^ 0xe) == 0) || ((uVar1 ^ 0xe) == 0 && local_58 == 0)) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar5 = "asdouble";
              pcVar4 = "";
            }
            else if (in_type->vecsize == 1 && (uVar7 == 0 && (uVar1 ^ 0xc) == 0)) {
              if (this->requires_explicit_fp16_packing == false) {
                this->requires_explicit_fp16_packing = true;
                Compiler::force_recompile((Compiler *)this);
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar5 = "spvUnpackFloat2x16";
              pcVar4 = "";
            }
            else {
              if (in_type->vecsize != 2 || (uVar6 != 0 || (uVar2 ^ 0xc) != 0)) {
                if (uVar1 == 6 && (uVar2 ^ 0xc) == 0) {
                  if ((this->hlsl_options).shader_model < 0x28) {
                    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_78,"Half to UShort requires Shader Model 4.","");
                    ::std::runtime_error::runtime_error(prVar3,(string *)&local_78);
                    *(undefined ***)prVar3 = &PTR__runtime_error_003fce08;
                    __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error
                               );
                  }
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_50,this,out_type,0);
                  ::std::operator+(&local_78,"(",&local_50);
                  ::std::operator+(__return_storage_ptr__,&local_78,")f32tof16");
                }
                else {
                  if ((uVar1 ^ 0xc) != 0 || uVar2 != 6) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    pcVar4 = "";
                    pcVar5 = pcVar4;
                    goto LAB_0026e1bc;
                  }
                  if ((this->hlsl_options).shader_model < 0x28) {
                    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_78,"UShort to Half requires Shader Model 4.","");
                    ::std::runtime_error::runtime_error(prVar3,(string *)&local_78);
                    *(undefined ***)prVar3 = &PTR__runtime_error_003fce08;
                    __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error
                               );
                  }
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_50,this,out_type,0);
                  ::std::operator+(&local_78,"(",&local_50);
                  ::std::operator+(__return_storage_ptr__,&local_78,")f16tof32");
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p == &local_50.field_2) {
                  return __return_storage_ptr__;
                }
                operator_delete(local_50._M_dataplus._M_p);
                return __return_storage_ptr__;
              }
              if (this->requires_explicit_fp16_packing == false) {
                this->requires_explicit_fp16_packing = true;
                Compiler::force_recompile((Compiler *)this);
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar5 = "spvPackFloat2x16";
              pcVar4 = "";
            }
          }
LAB_0026e1bc:
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,pcVar5,pcVar4);
          return __return_storage_ptr__;
        }
      }
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (__return_storage_ptr__,this,out_type,0);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Int)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Int64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
		return "asuint";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::UInt)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::UInt64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
		return "asint";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to Int64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to UInt64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvUnpackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvPackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("Half to UShort requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f32tof16";
	}
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("UShort to Half requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f16tof32";
	}
	else
		return "";
}